

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

stbi__uint16 * stbi__convert_format16(stbi__uint16 *data,int img_n,int req_comp,uint x,uint y)

{
  int iVar1;
  ushort uVar2;
  stbi__uint16 sVar3;
  uint uVar4;
  stbi__uint16 *__ptr;
  stbi__uint16 *psVar5;
  ushort *puVar6;
  char *pcVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  long *in_FS_OFFSET;
  undefined1 auVar13 [16];
  
  if (req_comp == img_n) {
    return data;
  }
  __ptr = (stbi__uint16 *)malloc((ulong)(req_comp * x * y * 2));
  if (__ptr == (stbi__uint16 *)0x0) {
    free(data);
    lVar10 = *in_FS_OFFSET;
    pcVar7 = "outofmem";
LAB_00140d39:
    *(char **)(lVar10 + -0x20) = pcVar7;
    __ptr = (stbi__uint16 *)0x0;
  }
  else {
    if (0 < (int)y) {
      uVar4 = req_comp + img_n * 8;
      if ((0x23 < uVar4) || ((0xe161a1c00U >> ((ulong)uVar4 & 0x3f) & 1) == 0)) {
        free(data);
        free(__ptr);
        lVar10 = *in_FS_OFFSET;
        pcVar7 = "unsupported";
        goto LAB_00140d39;
      }
      iVar1 = x - 1;
      uVar11 = 0;
      uVar12 = 0;
      uVar8 = 0;
      do {
        iVar9 = (int)uVar8 * x;
        if (uVar4 - 10 < 0x19) {
          puVar6 = data + (uint)(iVar9 * img_n);
          switch(uVar4) {
          case 10:
            if (-1 < iVar1) {
              lVar10 = 0;
              do {
                __ptr[uVar12 + lVar10 * 2] = data[uVar11 + lVar10];
                __ptr[uVar12 + lVar10 * 2 + 1] = 0xffff;
                lVar10 = lVar10 + 1;
              } while (x != (uint)lVar10);
            }
            break;
          case 0xb:
            if (-1 < iVar1) {
              psVar5 = __ptr + uVar12 + 2;
              lVar10 = 0;
              do {
                sVar3 = data[uVar11 + lVar10];
                *psVar5 = sVar3;
                psVar5[-1] = sVar3;
                psVar5[-2] = sVar3;
                lVar10 = lVar10 + 1;
                psVar5 = psVar5 + 3;
              } while (x != (uint)lVar10);
            }
            break;
          case 0xc:
            if (-1 < iVar1) {
              lVar10 = 0;
              do {
                auVar13._8_8_ = 0;
                auVar13._0_8_ = (ulong)data[uVar11 + lVar10] | 0xffff0000;
                auVar13 = pshuflw(auVar13,auVar13,0x40);
                *(long *)(__ptr + uVar12 + lVar10 * 4) = auVar13._0_8_;
                lVar10 = lVar10 + 1;
              } while (x != (uint)lVar10);
            }
            break;
          default:
            goto switchD_00140a36_caseD_d;
          case 0x11:
            if (-1 < iVar1) {
              lVar10 = 0;
              do {
                __ptr[uVar12 + lVar10] = data[uVar11 + lVar10 * 2];
                lVar10 = lVar10 + 1;
              } while (x != (uint)lVar10);
            }
            break;
          case 0x13:
            if (-1 < iVar1) {
              psVar5 = __ptr + uVar12 + 2;
              lVar10 = 0;
              do {
                sVar3 = data[uVar11 + lVar10 * 2];
                *psVar5 = sVar3;
                psVar5[-1] = sVar3;
                psVar5[-2] = sVar3;
                lVar10 = lVar10 + 1;
                psVar5 = psVar5 + 3;
              } while (x != (uint)lVar10);
            }
            break;
          case 0x14:
            if (-1 < iVar1) {
              lVar10 = 0;
              do {
                auVar13 = pshuflw(ZEXT416(*(uint *)(data + uVar11 + lVar10 * 2)),
                                  ZEXT416(*(uint *)(data + uVar11 + lVar10 * 2)),0x40);
                *(long *)(__ptr + uVar12 + lVar10 * 4) = auVar13._0_8_;
                lVar10 = lVar10 + 1;
              } while (x != (uint)lVar10);
            }
            break;
          case 0x19:
            if (-1 < iVar1) {
              lVar10 = 0;
              do {
                uVar2 = puVar6[2];
                __ptr[uVar12 + lVar10] =
                     (stbi__uint16)
                     ((uint)uVar2 * 2 + ((uint)uVar2 + (uint)uVar2 * 8) * 3 +
                      (uint)puVar6[1] * 0x96 + (uint)*puVar6 * 0x4d >> 8);
                lVar10 = lVar10 + 1;
                puVar6 = puVar6 + 3;
              } while (x != (uint)lVar10);
            }
            break;
          case 0x1a:
            if (-1 < iVar1) {
              lVar10 = 0;
              do {
                uVar2 = puVar6[2];
                __ptr[uVar12 + lVar10 * 2] =
                     (stbi__uint16)
                     ((uint)uVar2 * 2 + ((uint)uVar2 + (uint)uVar2 * 8) * 3 +
                      (uint)puVar6[1] * 0x96 + (uint)*puVar6 * 0x4d >> 8);
                __ptr[uVar12 + lVar10 * 2 + 1] = 0xffff;
                lVar10 = lVar10 + 1;
                puVar6 = puVar6 + 3;
              } while (x != (uint)lVar10);
            }
            break;
          case 0x1c:
            if (-1 < iVar1) {
              lVar10 = 0;
              do {
                *(undefined4 *)(__ptr + uVar12 + lVar10 * 4) = *(undefined4 *)puVar6;
                __ptr[uVar12 + lVar10 * 4 + 2] = puVar6[2];
                __ptr[uVar12 + lVar10 * 4 + 3] = 0xffff;
                lVar10 = lVar10 + 1;
                puVar6 = puVar6 + 3;
              } while (x != (uint)lVar10);
            }
            break;
          case 0x21:
            if (-1 < iVar1) {
              lVar10 = 0;
              do {
                uVar2 = data[uVar11 + lVar10 * 4 + 2];
                __ptr[uVar12 + lVar10] =
                     (stbi__uint16)
                     ((uint)uVar2 * 2 + ((uint)uVar2 + (uint)uVar2 * 8) * 3 +
                      (uint)data[uVar11 + lVar10 * 4 + 1] * 0x96 +
                      (uint)data[uVar11 + lVar10 * 4] * 0x4d >> 8);
                lVar10 = lVar10 + 1;
              } while (x != (uint)lVar10);
            }
            break;
          case 0x22:
            if (-1 < iVar1) {
              lVar10 = 0;
              do {
                uVar2 = data[uVar11 + lVar10 * 4 + 2];
                __ptr[uVar12 + lVar10 * 2] =
                     (stbi__uint16)
                     ((uint)uVar2 * 2 + ((uint)uVar2 + (uint)uVar2 * 8) * 3 +
                      (uint)data[uVar11 + lVar10 * 4 + 1] * 0x96 +
                      (uint)data[uVar11 + lVar10 * 4] * 0x4d >> 8);
                __ptr[uVar12 + lVar10 * 2 + 1] = data[uVar11 + lVar10 * 4 + 3];
                lVar10 = lVar10 + 1;
              } while (x != (uint)lVar10);
            }
          }
        }
        else {
switchD_00140a36_caseD_d:
          if (-1 < iVar1) {
            psVar5 = __ptr + (uint)(iVar9 * req_comp);
            lVar10 = 0;
            do {
              *(undefined4 *)psVar5 = *(undefined4 *)(data + uVar11 + lVar10 * 4);
              psVar5[2] = data[uVar11 + lVar10 * 4 + 2];
              lVar10 = lVar10 + 1;
              psVar5 = psVar5 + 3;
            } while (x != (uint)lVar10);
          }
        }
        uVar8 = uVar8 + 1;
        uVar12 = (ulong)((int)uVar12 + req_comp * x);
        uVar11 = (ulong)((int)uVar11 + x * img_n);
      } while (uVar8 != y);
    }
    free(data);
  }
  return __ptr;
}

Assistant:

static stbi__uint16 *stbi__convert_format16(stbi__uint16 *data, int img_n, int req_comp, unsigned int x, unsigned int y)
{
   int i,j;
   stbi__uint16 *good;

   if (req_comp == img_n) return data;
   STBI_ASSERT(req_comp >= 1 && req_comp <= 4);

   good = (stbi__uint16 *) stbi__malloc(req_comp * x * y * 2);
   if (good == NULL) {
      STBI_FREE(data);
      return (stbi__uint16 *) stbi__errpuc("outofmem", "Out of memory");
   }

   for (j=0; j < (int) y; ++j) {
      stbi__uint16 *src  = data + j * x * img_n   ;
      stbi__uint16 *dest = good + j * x * req_comp;

      #define STBI__COMBO(a,b)  ((a)*8+(b))
      #define STBI__CASE(a,b)   case STBI__COMBO(a,b): for(i=x-1; i >= 0; --i, src += a, dest += b)
      // convert source image with img_n components to one with req_comp components;
      // avoid switch per pixel, so use switch per scanline and massive macros
      switch (STBI__COMBO(img_n, req_comp)) {
         STBI__CASE(1,2) { dest[0]=src[0]; dest[1]=0xffff;                                     } break;
         STBI__CASE(1,3) { dest[0]=dest[1]=dest[2]=src[0];                                     } break;
         STBI__CASE(1,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=0xffff;                     } break;
         STBI__CASE(2,1) { dest[0]=src[0];                                                     } break;
         STBI__CASE(2,3) { dest[0]=dest[1]=dest[2]=src[0];                                     } break;
         STBI__CASE(2,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=src[1];                     } break;
         STBI__CASE(3,4) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];dest[3]=0xffff;        } break;
         STBI__CASE(3,1) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]);                   } break;
         STBI__CASE(3,2) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]); dest[1] = 0xffff; } break;
         STBI__CASE(4,1) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]);                   } break;
         STBI__CASE(4,2) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]); dest[1] = src[3]; } break;
         STBI__CASE(4,3) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];                       } break;
         default: STBI_ASSERT(0); STBI_FREE(data); STBI_FREE(good); return (stbi__uint16*) stbi__errpuc("unsupported", "Unsupported format conversion");
      }
      #undef STBI__CASE
   }

   STBI_FREE(data);
   return good;
}